

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.cc
# Opt level: O2

void BF_ecb_encrypt(uchar *in,uchar *out,BF_KEY *key,int enc)

{
  uint uVar1;
  uint local_10;
  uint local_c;
  
  uVar1 = *(uint *)in;
  local_10 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = *(uint *)(in + 4);
  local_c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if (enc == 0) {
    BF_decrypt(&local_10,key);
  }
  else {
    BF_encrypt(&local_10,key);
  }
  *(uint *)out = local_10 >> 0x18 | (local_10 & 0xff0000) >> 8 | (local_10 & 0xff00) << 8 |
                 local_10 << 0x18;
  *(uint *)(out + 4) =
       local_c >> 0x18 | (local_c & 0xff0000) >> 8 | (local_c & 0xff00) << 8 | local_c << 0x18;
  return;
}

Assistant:

void BF_ecb_encrypt(const uint8_t *in, uint8_t *out, const BF_KEY *key,
                    int encrypt) {
  uint32_t d[2];

  n2l(in, d[0]);
  n2l(in, d[1]);
  if (encrypt) {
    BF_encrypt(d, key);
  } else {
    BF_decrypt(d, key);
  }
  l2n(d[0], out);
  l2n(d[1], out);
}